

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O2

void internal_counters_set_mgga(int nspin,xc_dimensions *dim)

{
  int iVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  long lVar13;
  int iVar14;
  long local_198;
  long local_190;
  long local_188;
  long local_180;
  long local_178;
  long local_170;
  long local_168;
  long local_160;
  long local_158;
  long local_150;
  long local_148;
  long local_140;
  long local_138;
  long local_130;
  long local_128;
  long local_120;
  long local_118;
  long local_110;
  long local_108;
  long local_100;
  long local_f8;
  long local_f0;
  long local_e8;
  long local_e0;
  long local_d8;
  long local_d0;
  long local_c8;
  long local_c0;
  long local_b8;
  long local_b0;
  long local_a8;
  long local_a0;
  long local_98;
  long local_90;
  long local_88;
  long local_80;
  long local_78;
  long local_70;
  long local_68;
  long local_60;
  long local_58;
  long local_50;
  long local_48;
  long local_40;
  long local_38;
  
  internal_counters_set_gga(nspin,dim);
  dim->vlapl = nspin;
  dim->lapl = nspin;
  dim->vtau = nspin;
  dim->tau = nspin;
  if (nspin == 1) {
    dim->v2tau2 = 1;
    dim->v2lapl2 = 1;
    dim->v2lapltau = 1;
    dim->v2rholapl = 1;
    dim->v2rhotau = 1;
    local_38 = 0x10c;
    local_40 = 0x110;
    local_48 = 0x114;
    local_50 = 0x118;
    local_58 = 0xfc;
    local_60 = 0x100;
    local_68 = 0x104;
    local_70 = 0x108;
    local_78 = 0xec;
    local_80 = 0xf0;
    local_88 = 0xf4;
    local_90 = 0xf8;
    local_98 = 0xdc;
    local_a0 = 0xe4;
    local_a8 = 0xe8;
    local_b0 = 0xd0;
    local_b8 = 0xd4;
    local_c0 = 0xd8;
    local_c8 = 0xc0;
    local_d0 = 0xc4;
    local_d8 = 200;
    local_e0 = 0xcc;
    local_e8 = 0xb0;
    local_f0 = 0xb4;
    local_f8 = 0xb8;
    local_100 = 0xbc;
    local_108 = 0x9c;
    local_110 = 0xa0;
    local_118 = 0xa4;
    local_120 = 0xa8;
    local_128 = 0xac;
    local_130 = 0x60;
    local_138 = 100;
    local_140 = 0x84;
    local_148 = 0x80;
    local_150 = 0x88;
    local_158 = 0x78;
    local_160 = 0x7c;
    local_168 = 0x70;
    local_170 = 0x90;
    local_178 = 0x94;
    local_180 = 0x6c;
    local_188 = 0x8c;
    local_190 = 0x98;
    local_198 = 0x54;
    lVar7 = 0x58;
    lVar13 = 0x68;
    lVar4 = 0x38;
    iVar14 = 1;
    lVar6 = 0x3c;
    iVar3 = iVar14;
    iVar5 = iVar14;
    iVar11 = iVar14;
    iVar9 = iVar14;
    iVar8 = iVar14;
    iVar12 = iVar14;
    iVar1 = iVar14;
    iVar2 = iVar14;
    iVar10 = iVar14;
  }
  else {
    dim->vlapl = 2;
    dim->vtau = 2;
    local_38 = 0x118;
    iVar10 = 5;
    local_40 = 0x114;
    local_48 = 0x110;
    local_50 = 0x10c;
    local_58 = 0x108;
    local_60 = 0x104;
    local_68 = 0x100;
    local_70 = 0xfc;
    local_78 = 0xf8;
    local_80 = 0xf4;
    iVar2 = 0x14;
    local_88 = 0xf0;
    local_90 = 0xe8;
    local_98 = 0xe4;
    local_a0 = 0xdc;
    local_a8 = 0xd8;
    local_b0 = 0xd4;
    local_b8 = 0xd0;
    local_c0 = 0xcc;
    iVar1 = 0x18;
    local_c8 = 200;
    local_d0 = 0xc0;
    local_d8 = 0xbc;
    local_e0 = 0xb8;
    local_e8 = 0xb4;
    iVar12 = 0x12;
    local_f0 = 0xb0;
    local_f8 = 0xa8;
    local_100 = 0xa4;
    local_108 = 0x98;
    local_110 = 0x94;
    local_118 = 0x90;
    local_120 = 0x8c;
    local_128 = 0x88;
    local_130 = 0x84;
    iVar8 = 9;
    local_138 = 0x80;
    local_140 = 0x7c;
    local_148 = 0x78;
    local_150 = 0x70;
    iVar9 = 8;
    local_158 = 0x6c;
    local_160 = 0x68;
    local_168 = 100;
    iVar11 = 0xc;
    local_170 = 0x60;
    local_178 = 0x58;
    local_180 = 0x54;
    local_188 = 0x48;
    local_190 = 0x44;
    iVar5 = 3;
    local_198 = 0x40;
    lVar7 = 0x3c;
    iVar3 = 6;
    lVar13 = 0x38;
    lVar4 = 0x30;
    iVar14 = 4;
    lVar6 = 0x2c;
  }
  *(int *)((long)&dim->rho + lVar6) = iVar14;
  *(int *)((long)&dim->rho + lVar4) = iVar14;
  *(int *)((long)&dim->rho + lVar13) = iVar3;
  *(int *)((long)&dim->rho + lVar7) = iVar3;
  *(int *)((long)&dim->rho + local_198) = iVar5;
  *(int *)((long)&dim->rho + local_190) = iVar14;
  *(int *)((long)&dim->rho + local_188) = iVar5;
  *(int *)((long)&dim->rho + local_180) = iVar3;
  *(int *)((long)&dim->rho + local_178) = iVar3;
  *(int *)((long)&dim->rho + local_170) = iVar11;
  *(int *)((long)&dim->rho + local_168) = iVar11;
  *(int *)((long)&dim->rho + local_160) = iVar3;
  *(int *)((long)&dim->rho + local_158) = iVar9;
  *(int *)((long)&dim->rho + local_150) = iVar3;
  *(int *)((long)&dim->rho + local_148) = iVar11;
  *(int *)((long)&dim->rho + local_140) = iVar11;
  *(int *)((long)&dim->rho + local_138) = iVar8;
  *(int *)((long)&dim->rho + local_130) = iVar11;
  *(int *)((long)&dim->rho + local_128) = iVar8;
  *(int *)((long)&dim->rho + local_120) = iVar14;
  *(int *)((long)&dim->rho + local_118) = iVar3;
  *(int *)((long)&dim->rho + local_110) = iVar3;
  *(int *)((long)&dim->rho + local_108) = iVar14;
  *(int *)((long)&dim->rho + local_100) = iVar9;
  *(int *)((long)&dim->rho + local_f8) = iVar9;
  *(int *)((long)&dim->rho + local_f0) = iVar12;
  *(int *)((long)&dim->rho + local_e8) = iVar12;
  *(int *)((long)&dim->rho + local_e0) = iVar8;
  *(int *)((long)&dim->rho + local_d8) = iVar11;
  *(int *)((long)&dim->rho + local_d0) = iVar8;
  *(int *)((long)&dim->rho + local_c8) = iVar1;
  *(int *)((long)&dim->rho + local_c0) = iVar1;
  *(int *)((long)&dim->rho + local_b8) = iVar12;
  *(int *)((long)&dim->rho + local_b0) = iVar1;
  *(int *)((long)&dim->rho + local_a8) = iVar12;
  *(int *)((long)&dim->rho + local_a0) = iVar9;
  dim->v4rholapl2tau = iVar11;
  *(int *)((long)&dim->rho + local_98) = iVar11;
  *(int *)((long)&dim->rho + local_90) = iVar9;
  *(int *)((long)&dim->rho + local_88) = iVar2;
  *(int *)((long)&dim->rho + local_80) = iVar2;
  *(int *)((long)&dim->rho + local_78) = iVar12;
  *(int *)((long)&dim->rho + local_70) = iVar1;
  *(int *)((long)&dim->rho + local_68) = iVar12;
  *(int *)((long)&dim->rho + local_60) = iVar11;
  *(int *)((long)&dim->rho + local_58) = iVar12;
  *(int *)((long)&dim->rho + local_50) = iVar12;
  *(int *)((long)&dim->rho + local_48) = iVar11;
  *(int *)((long)&dim->rho + local_40) = iVar10;
  *(int *)((long)&dim->rho + local_38) = iVar9;
  dim->v4tau4 = iVar10;
  dim->v4lapltau3 = iVar9;
  dim->v4lapl2tau2 = iVar8;
  return;
}

Assistant:

void
internal_counters_set_mgga(int nspin, xc_dimensions *dim)
{
  internal_counters_set_gga(nspin, dim);
  dim->lapl = dim->vlapl = nspin;
  dim->tau  = dim->vtau  = nspin;

  if(nspin == XC_UNPOLARIZED){
    dim->v2lapl2 = dim->v2tau2 = 1;
    dim->v2rholapl = dim->v2rhotau = dim->v2lapltau = 1;
    dim->v2sigmalapl = dim->v2sigmatau = 1;

    dim->v3lapl3 = dim->v3tau3 = dim->v3rho2lapl = dim->v3rho2tau = dim->v3rholapl2 = 1;
    dim->v3rhotau2 = dim->v3lapl2tau = dim->v3lapltau2 = dim->v3rholapltau = 1;
    dim->v3sigmalapl2 = dim->v3sigmatau2 = dim->v3sigma2lapl = dim->v3sigma2tau = 1;
    dim->v3rhosigmalapl = dim->v3rhosigmatau = dim->v3sigmalapltau = 1;

    dim->v4rho4 = dim->v4rho3sigma = dim->v4rho3lapl = dim->v4rho3tau = dim->v4rho2sigma2 = 1;
    dim->v4rho2sigmalapl = dim->v4rho2sigmatau = dim->v4rho2lapl2 = dim->v4rho2lapltau = 1;
    dim->v4rho2tau2 = dim->v4rhosigma3 = dim->v4rhosigma2lapl = dim->v4rhosigma2tau = 1;
    dim->v4rhosigmalapl2 = dim->v4rhosigmalapltau = dim->v4rhosigmatau2 = 1;
    dim->v4rholapl3 = dim->v4rholapl2tau = dim->v4rholapltau2 = dim->v4rhotau3 = 1;
    dim->v4sigma4 = dim->v4sigma3lapl = dim->v4sigma3tau = dim->v4sigma2lapl2 = 1;
    dim->v4sigma2lapltau = dim->v4sigma2tau2 = dim->v4sigmalapl3 = dim->v4sigmalapl2tau = 1;
    dim->v4sigmalapltau2 = dim->v4sigmatau3 = dim->v4lapl4 = dim->v4lapl3tau = 1;
    dim->v4lapl2tau2 = dim->v4lapltau3 = dim->v4tau4 =1;
  }else{
    dim->vlapl             = 2;
    dim->vtau              = 2;

    /* in total: 30 */
    dim->v2rholapl         = 2*2;
    dim->v2rhotau          = 2*2;
    dim->v2sigmalapl       = 3*2;
    dim->v2sigmatau        = 3*2;
    dim->v2lapl2           = 3;
    dim->v2lapltau         = 2*2;
    dim->v2tau2            = 3;

    /* in total: 130 */
    dim->v3rho2lapl        = 3*2;
    dim->v3rho2tau         = 3*2;
    dim->v3rhosigmalapl    = 2*3*2;
    dim->v3rhosigmatau     = 2*3*2;
    dim->v3rholapl2        = 2*3;
    dim->v3rholapltau      = 2*2*2;
    dim->v3rhotau2         = 2*3;
    dim->v3sigma2lapl      = 6*2;
    dim->v3sigma2tau       = 6*2;
    dim->v3sigmalapl2      = 3*3;
    dim->v3sigmalapltau    = 3*2*2;
    dim->v3sigmatau2       = 3*3;
    dim->v3lapl3           = 4;
    dim->v3lapl2tau        = 3*2;
    dim->v3lapltau2        = 2*3;
    dim->v3tau3            = 4;

    /* in total: 425 */
    dim->v4rho3lapl        = 4*2;
    dim->v4rho3tau         = 4*2;
    dim->v4rho2sigmalapl   = 3*3*2;
    dim->v4rho2sigmatau    = 3*3*2;
    dim->v4rho2lapl2       = 3*3;
    dim->v4rho2lapltau     = 3*2*2;
    dim->v4rho2tau2        = 3*3;
    dim->v4rhosigma2lapl   = 2*6*2;
    dim->v4rhosigma2tau    = 2*6*2;
    dim->v4rhosigmalapl2   = 2*3*3;
    dim->v4rhosigmalapltau = 2*3*2*2;
    dim->v4rhosigmatau2    = 2*3*3;
    dim->v4rholapl3        = 2*4;
    dim->v4rholapl2tau     = 2*3*2;
    dim->v4rholapltau2     = 2*2*3;
    dim->v4rhotau3         = 2*4;
    dim->v4sigma3lapl      = 10*2;
    dim->v4sigma3tau       = 10*2;
    dim->v4sigma2lapl2     = 6*3;
    dim->v4sigma2lapltau   = 6*2*2;
    dim->v4sigma2tau2      = 6*3;
    dim->v4sigmalapl3      = 3*4;
    dim->v4sigmalapl2tau   = 3*3*2;
    dim->v4sigmalapltau2   = 3*2*3;
    dim->v4sigmatau3       = 3*4;
    dim->v4lapl4           = 5;
    dim->v4lapl3tau        = 4*2;
    dim->v4lapl2tau2       = 3*3;
    dim->v4lapltau3        = 2*4;
    dim->v4tau4            = 5;
  }
}